

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void VP8YuvToRgb32_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  __m128i *in_RCX;
  __m128i rgb5;
  __m128i rgb4;
  __m128i rgb3;
  __m128i rgb2;
  __m128i rgb1;
  __m128i rgb0;
  __m128i B3;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i G3;
  __m128i G2;
  __m128i G1;
  __m128i G0;
  __m128i R3;
  __m128i R2;
  __m128i R1;
  __m128i R0;
  __m128i *in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe19;
  undefined1 in_stack_fffffffffffffe1a;
  undefined1 in_stack_fffffffffffffe1b;
  undefined1 in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1d;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  undefined1 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe21;
  undefined1 in_stack_fffffffffffffe22;
  undefined1 in_stack_fffffffffffffe23;
  undefined1 in_stack_fffffffffffffe24;
  undefined1 in_stack_fffffffffffffe25;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  undefined1 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe29;
  undefined1 in_stack_fffffffffffffe2a;
  undefined1 in_stack_fffffffffffffe2b;
  undefined1 in_stack_fffffffffffffe2c;
  undefined1 in_stack_fffffffffffffe2d;
  undefined1 in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  undefined1 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe31;
  undefined1 in_stack_fffffffffffffe32;
  undefined1 in_stack_fffffffffffffe33;
  undefined1 in_stack_fffffffffffffe34;
  undefined1 in_stack_fffffffffffffe35;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  undefined1 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe39;
  undefined1 in_stack_fffffffffffffe3a;
  undefined1 in_stack_fffffffffffffe3b;
  undefined1 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3d;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  undefined1 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe41;
  undefined1 in_stack_fffffffffffffe42;
  undefined1 in_stack_fffffffffffffe43;
  undefined1 in_stack_fffffffffffffe44;
  undefined1 in_stack_fffffffffffffe45;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_178;
  undefined8 uStack_170;
  uint8_t *in_stack_fffffffffffffed0;
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  
  YUV444ToRGB_SSE2((uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,
                                     CONCAT15(in_stack_fffffffffffffe45,
                                              CONCAT14(in_stack_fffffffffffffe44,
                                                       CONCAT13(in_stack_fffffffffffffe43,
                                                                CONCAT12(in_stack_fffffffffffffe42,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe41,
                                                  in_stack_fffffffffffffe40))))))),
                   (uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe3f,
                            CONCAT16(in_stack_fffffffffffffe3e,
                                     CONCAT15(in_stack_fffffffffffffe3d,
                                              CONCAT14(in_stack_fffffffffffffe3c,
                                                       CONCAT13(in_stack_fffffffffffffe3b,
                                                                CONCAT12(in_stack_fffffffffffffe3a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe39,
                                                  in_stack_fffffffffffffe38))))))),
                   (uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe37,
                            CONCAT16(in_stack_fffffffffffffe36,
                                     CONCAT15(in_stack_fffffffffffffe35,
                                              CONCAT14(in_stack_fffffffffffffe34,
                                                       CONCAT13(in_stack_fffffffffffffe33,
                                                                CONCAT12(in_stack_fffffffffffffe32,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe2f,
                            CONCAT16(in_stack_fffffffffffffe2e,
                                     CONCAT15(in_stack_fffffffffffffe2d,
                                              CONCAT14(in_stack_fffffffffffffe2c,
                                                       CONCAT13(in_stack_fffffffffffffe2b,
                                                                CONCAT12(in_stack_fffffffffffffe2a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe29,
                                                  in_stack_fffffffffffffe28))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe27,
                            CONCAT16(in_stack_fffffffffffffe26,
                                     CONCAT15(in_stack_fffffffffffffe25,
                                              CONCAT14(in_stack_fffffffffffffe24,
                                                       CONCAT13(in_stack_fffffffffffffe23,
                                                                CONCAT12(in_stack_fffffffffffffe22,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe21,
                                                  in_stack_fffffffffffffe20))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe1f,
                            CONCAT16(in_stack_fffffffffffffe1e,
                                     CONCAT15(in_stack_fffffffffffffe1d,
                                              CONCAT14(in_stack_fffffffffffffe1c,
                                                       CONCAT13(in_stack_fffffffffffffe1b,
                                                                CONCAT12(in_stack_fffffffffffffe1a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))));
  YUV444ToRGB_SSE2((uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,
                                     CONCAT15(in_stack_fffffffffffffe45,
                                              CONCAT14(in_stack_fffffffffffffe44,
                                                       CONCAT13(in_stack_fffffffffffffe43,
                                                                CONCAT12(in_stack_fffffffffffffe42,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe41,
                                                  in_stack_fffffffffffffe40))))))),
                   (uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe3f,
                            CONCAT16(in_stack_fffffffffffffe3e,
                                     CONCAT15(in_stack_fffffffffffffe3d,
                                              CONCAT14(in_stack_fffffffffffffe3c,
                                                       CONCAT13(in_stack_fffffffffffffe3b,
                                                                CONCAT12(in_stack_fffffffffffffe3a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe39,
                                                  in_stack_fffffffffffffe38))))))),
                   (uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe37,
                            CONCAT16(in_stack_fffffffffffffe36,
                                     CONCAT15(in_stack_fffffffffffffe35,
                                              CONCAT14(in_stack_fffffffffffffe34,
                                                       CONCAT13(in_stack_fffffffffffffe33,
                                                                CONCAT12(in_stack_fffffffffffffe32,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe2f,
                            CONCAT16(in_stack_fffffffffffffe2e,
                                     CONCAT15(in_stack_fffffffffffffe2d,
                                              CONCAT14(in_stack_fffffffffffffe2c,
                                                       CONCAT13(in_stack_fffffffffffffe2b,
                                                                CONCAT12(in_stack_fffffffffffffe2a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe29,
                                                  in_stack_fffffffffffffe28))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe27,
                            CONCAT16(in_stack_fffffffffffffe26,
                                     CONCAT15(in_stack_fffffffffffffe25,
                                              CONCAT14(in_stack_fffffffffffffe24,
                                                       CONCAT13(in_stack_fffffffffffffe23,
                                                                CONCAT12(in_stack_fffffffffffffe22,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe21,
                                                  in_stack_fffffffffffffe20))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe1f,
                            CONCAT16(in_stack_fffffffffffffe1e,
                                     CONCAT15(in_stack_fffffffffffffe1d,
                                              CONCAT14(in_stack_fffffffffffffe1c,
                                                       CONCAT13(in_stack_fffffffffffffe1b,
                                                                CONCAT12(in_stack_fffffffffffffe1a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))));
  YUV444ToRGB_SSE2((uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,
                                     CONCAT15(in_stack_fffffffffffffe45,
                                              CONCAT14(in_stack_fffffffffffffe44,
                                                       CONCAT13(in_stack_fffffffffffffe43,
                                                                CONCAT12(in_stack_fffffffffffffe42,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe41,
                                                  in_stack_fffffffffffffe40))))))),
                   (uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe3f,
                            CONCAT16(in_stack_fffffffffffffe3e,
                                     CONCAT15(in_stack_fffffffffffffe3d,
                                              CONCAT14(in_stack_fffffffffffffe3c,
                                                       CONCAT13(in_stack_fffffffffffffe3b,
                                                                CONCAT12(in_stack_fffffffffffffe3a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe39,
                                                  in_stack_fffffffffffffe38))))))),
                   (uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe37,
                            CONCAT16(in_stack_fffffffffffffe36,
                                     CONCAT15(in_stack_fffffffffffffe35,
                                              CONCAT14(in_stack_fffffffffffffe34,
                                                       CONCAT13(in_stack_fffffffffffffe33,
                                                                CONCAT12(in_stack_fffffffffffffe32,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe2f,
                            CONCAT16(in_stack_fffffffffffffe2e,
                                     CONCAT15(in_stack_fffffffffffffe2d,
                                              CONCAT14(in_stack_fffffffffffffe2c,
                                                       CONCAT13(in_stack_fffffffffffffe2b,
                                                                CONCAT12(in_stack_fffffffffffffe2a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe29,
                                                  in_stack_fffffffffffffe28))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe27,
                            CONCAT16(in_stack_fffffffffffffe26,
                                     CONCAT15(in_stack_fffffffffffffe25,
                                              CONCAT14(in_stack_fffffffffffffe24,
                                                       CONCAT13(in_stack_fffffffffffffe23,
                                                                CONCAT12(in_stack_fffffffffffffe22,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe21,
                                                  in_stack_fffffffffffffe20))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe1f,
                            CONCAT16(in_stack_fffffffffffffe1e,
                                     CONCAT15(in_stack_fffffffffffffe1d,
                                              CONCAT14(in_stack_fffffffffffffe1c,
                                                       CONCAT13(in_stack_fffffffffffffe1b,
                                                                CONCAT12(in_stack_fffffffffffffe1a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))));
  YUV444ToRGB_SSE2((uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,
                                     CONCAT15(in_stack_fffffffffffffe45,
                                              CONCAT14(in_stack_fffffffffffffe44,
                                                       CONCAT13(in_stack_fffffffffffffe43,
                                                                CONCAT12(in_stack_fffffffffffffe42,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe41,
                                                  in_stack_fffffffffffffe40))))))),
                   (uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe3f,
                            CONCAT16(in_stack_fffffffffffffe3e,
                                     CONCAT15(in_stack_fffffffffffffe3d,
                                              CONCAT14(in_stack_fffffffffffffe3c,
                                                       CONCAT13(in_stack_fffffffffffffe3b,
                                                                CONCAT12(in_stack_fffffffffffffe3a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe39,
                                                  in_stack_fffffffffffffe38))))))),
                   (uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe37,
                            CONCAT16(in_stack_fffffffffffffe36,
                                     CONCAT15(in_stack_fffffffffffffe35,
                                              CONCAT14(in_stack_fffffffffffffe34,
                                                       CONCAT13(in_stack_fffffffffffffe33,
                                                                CONCAT12(in_stack_fffffffffffffe32,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe31,
                                                  in_stack_fffffffffffffe30))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe2f,
                            CONCAT16(in_stack_fffffffffffffe2e,
                                     CONCAT15(in_stack_fffffffffffffe2d,
                                              CONCAT14(in_stack_fffffffffffffe2c,
                                                       CONCAT13(in_stack_fffffffffffffe2b,
                                                                CONCAT12(in_stack_fffffffffffffe2a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe29,
                                                  in_stack_fffffffffffffe28))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe27,
                            CONCAT16(in_stack_fffffffffffffe26,
                                     CONCAT15(in_stack_fffffffffffffe25,
                                              CONCAT14(in_stack_fffffffffffffe24,
                                                       CONCAT13(in_stack_fffffffffffffe23,
                                                                CONCAT12(in_stack_fffffffffffffe22,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe21,
                                                  in_stack_fffffffffffffe20))))))),
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffe1f,
                            CONCAT16(in_stack_fffffffffffffe1e,
                                     CONCAT15(in_stack_fffffffffffffe1d,
                                              CONCAT14(in_stack_fffffffffffffe1c,
                                                       CONCAT13(in_stack_fffffffffffffe1b,
                                                                CONCAT12(in_stack_fffffffffffffe1a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))));
  local_98 = (short)local_178;
  uStack_96 = (short)((ulong)local_178 >> 0x10);
  uStack_94 = (short)((ulong)local_178 >> 0x20);
  uStack_92 = (short)((ulong)local_178 >> 0x30);
  uStack_90 = (short)uStack_170;
  uStack_8e = (short)((ulong)uStack_170 >> 0x10);
  uStack_8c = (short)((ulong)uStack_170 >> 0x20);
  uStack_8a = (short)((ulong)uStack_170 >> 0x30);
  local_b8 = (short)local_198;
  uStack_b6 = (short)((ulong)local_198 >> 0x10);
  uStack_b4 = (short)((ulong)local_198 >> 0x20);
  uStack_b2 = (short)((ulong)local_198 >> 0x30);
  uStack_b0 = (short)uStack_190;
  uStack_ae = (short)((ulong)uStack_190 >> 0x10);
  uStack_ac = (short)((ulong)uStack_190 >> 0x20);
  uStack_aa = (short)((ulong)uStack_190 >> 0x30);
  local_c8 = (short)local_1a8;
  uStack_c6 = (short)((ulong)local_1a8 >> 0x10);
  uStack_c4 = (short)((ulong)local_1a8 >> 0x20);
  uStack_c2 = (short)((ulong)local_1a8 >> 0x30);
  uStack_c0 = (short)uStack_1a0;
  uStack_be = (short)((ulong)uStack_1a0 >> 0x10);
  uStack_bc = (short)((ulong)uStack_1a0 >> 0x20);
  uStack_ba = (short)((ulong)uStack_1a0 >> 0x30);
  PlanarTo24b_SSE2((__m128i *)
                   CONCAT17((0 < uStack_8a) * (uStack_8a < 0x100) *
                            (char)((ulong)uStack_170 >> 0x30) - (0xff < uStack_8a),
                            CONCAT16((0 < uStack_8c) * (uStack_8c < 0x100) *
                                     (char)((ulong)uStack_170 >> 0x20) - (0xff < uStack_8c),
                                     CONCAT15((0 < uStack_8e) * (uStack_8e < 0x100) *
                                              (char)((ulong)uStack_170 >> 0x10) - (0xff < uStack_8e)
                                              ,CONCAT14((0 < uStack_90) * (uStack_90 < 0x100) *
                                                        (char)uStack_170 - (0xff < uStack_90),
                                                        CONCAT13((0 < uStack_92) *
                                                                 (uStack_92 < 0x100) *
                                                                 (char)((ulong)local_178 >> 0x30) -
                                                                 (0xff < uStack_92),
                                                                 CONCAT12((0 < uStack_94) *
                                                                          (uStack_94 < 0x100) *
                                                                          (char)((ulong)local_178 >>
                                                                                0x20) -
                                                                          (0xff < uStack_94),
                                                                          CONCAT11((0 < uStack_96) *
                                                                                   (uStack_96 <
                                                                                   0x100) * (char)((
                                                  ulong)local_178 >> 0x10) - (0xff < uStack_96),
                                                  (0 < local_98) * (local_98 < 0x100) *
                                                  (char)local_178 - (0xff < local_98)))))))),
                   (__m128i *)
                   CONCAT17((0 < uStack_ba) * (uStack_ba < 0x100) *
                            (char)((ulong)uStack_1a0 >> 0x30) - (0xff < uStack_ba),
                            CONCAT16((0 < uStack_bc) * (uStack_bc < 0x100) *
                                     (char)((ulong)uStack_1a0 >> 0x20) - (0xff < uStack_bc),
                                     CONCAT15((0 < uStack_be) * (uStack_be < 0x100) *
                                              (char)((ulong)uStack_1a0 >> 0x10) - (0xff < uStack_be)
                                              ,CONCAT14((0 < uStack_c0) * (uStack_c0 < 0x100) *
                                                        (char)uStack_1a0 - (0xff < uStack_c0),
                                                        CONCAT13((0 < uStack_c2) *
                                                                 (uStack_c2 < 0x100) *
                                                                 (char)((ulong)local_1a8 >> 0x30) -
                                                                 (0xff < uStack_c2),
                                                                 CONCAT12((0 < uStack_c4) *
                                                                          (uStack_c4 < 0x100) *
                                                                          (char)((ulong)local_1a8 >>
                                                                                0x20) -
                                                                          (0xff < uStack_c4),
                                                                          CONCAT11((0 < uStack_c6) *
                                                                                   (uStack_c6 <
                                                                                   0x100) * (char)((
                                                  ulong)local_1a8 >> 0x10) - (0xff < uStack_c6),
                                                  (0 < local_c8) * (local_c8 < 0x100) *
                                                  (char)local_1a8 - (0xff < local_c8)))))))),
                   (__m128i *)
                   CONCAT17((0 < uStack_aa) * (uStack_aa < 0x100) *
                            (char)((ulong)uStack_190 >> 0x30) - (0xff < uStack_aa),
                            CONCAT16((0 < uStack_ac) * (uStack_ac < 0x100) *
                                     (char)((ulong)uStack_190 >> 0x20) - (0xff < uStack_ac),
                                     CONCAT15((0 < uStack_ae) * (uStack_ae < 0x100) *
                                              (char)((ulong)uStack_190 >> 0x10) - (0xff < uStack_ae)
                                              ,CONCAT14((0 < uStack_b0) * (uStack_b0 < 0x100) *
                                                        (char)uStack_190 - (0xff < uStack_b0),
                                                        CONCAT13((0 < uStack_b2) *
                                                                 (uStack_b2 < 0x100) *
                                                                 (char)((ulong)local_198 >> 0x30) -
                                                                 (0xff < uStack_b2),
                                                                 CONCAT12((0 < uStack_b4) *
                                                                          (uStack_b4 < 0x100) *
                                                                          (char)((ulong)local_198 >>
                                                                                0x20) -
                                                                          (0xff < uStack_b4),
                                                                          CONCAT11((0 < uStack_b6) *
                                                                                   (uStack_b6 <
                                                                                   0x100) * (char)((
                                                  ulong)local_198 >> 0x10) - (0xff < uStack_b6),
                                                  (0 < local_b8) * (local_b8 < 0x100) *
                                                  (char)local_198 - (0xff < local_b8)))))))),
                   in_stack_fffffffffffffdf0,in_RCX,(__m128i *)0x14d738,in_stack_fffffffffffffed0);
  return;
}

Assistant:

void VP8YuvToRgb32_SSE2(const uint8_t* WEBP_RESTRICT y,
                        const uint8_t* WEBP_RESTRICT u,
                        const uint8_t* WEBP_RESTRICT v,
                        uint8_t* WEBP_RESTRICT dst) {
  __m128i R0, R1, R2, R3, G0, G1, G2, G3, B0, B1, B2, B3;
  __m128i rgb0, rgb1, rgb2, rgb3, rgb4, rgb5;

  YUV444ToRGB_SSE2(y + 0, u + 0, v + 0, &R0, &G0, &B0);
  YUV444ToRGB_SSE2(y + 8, u + 8, v + 8, &R1, &G1, &B1);
  YUV444ToRGB_SSE2(y + 16, u + 16, v + 16, &R2, &G2, &B2);
  YUV444ToRGB_SSE2(y + 24, u + 24, v + 24, &R3, &G3, &B3);

  // Cast to 8b and store as RRRRGGGGBBBB.
  rgb0 = _mm_packus_epi16(R0, R1);
  rgb1 = _mm_packus_epi16(R2, R3);
  rgb2 = _mm_packus_epi16(G0, G1);
  rgb3 = _mm_packus_epi16(G2, G3);
  rgb4 = _mm_packus_epi16(B0, B1);
  rgb5 = _mm_packus_epi16(B2, B3);

  // Pack as RGBRGBRGBRGB.
  PlanarTo24b_SSE2(&rgb0, &rgb1, &rgb2, &rgb3, &rgb4, &rgb5, dst);
}